

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

char * fmt::v11::detail::parse_format_specs<char>
                 (char *begin,char *end,dynamic_format_specs<char> *specs,parse_context<char> *ctx,
                 type arg_type)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  bool valid;
  int set;
  uint uVar6;
  pres pres_type;
  uint uVar7;
  char *pcVar8;
  basic_string_view<char> s;
  anon_struct_4_1_8b22846b enter_state;
  char *begin_local;
  uint local_74;
  anon_struct_24_3_3d55a02b parse_presentation_type;
  
  if ((long)end - (long)begin < 2) {
    if (begin == end) {
      return begin;
    }
  }
  else if (((byte)begin[1] - 0x3c < 0x23) &&
          ((0x400000005U >> ((ulong)((byte)begin[1] - 0x3c) & 0x3f) & 1) != 0)) {
    cVar3 = '\0';
    goto LAB_001ea890;
  }
  cVar3 = *begin;
LAB_001ea890:
  enter_state.current_state = start;
  parse_presentation_type.begin = &begin_local;
  uVar7 = 1 << ((byte)arg_type & 0x1f);
  local_74 = arg_type - int_type;
  begin_local = begin;
  parse_presentation_type.specs = &specs->super_format_specs;
  parse_presentation_type.arg_type = arg_type;
  do {
    pcVar5 = begin_local;
    switch(cVar3) {
    case ' ':
    case '+':
      (specs->super_format_specs).super_basic_specs.data_ =
           ((specs->super_format_specs).super_basic_specs.data_ & 0xfffff3ff) +
           (uint)(cVar3 == ' ') * 0x400 + 0x800;
    case '-':
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                (&enter_state,sign,(uVar7 & 0xe2a) != 0);
      break;
    default:
      bVar2 = *begin_local;
      if (bVar2 == 0x7d) {
        return begin_local;
      }
      uVar4 = (ulong)((uint)(0x3a55000000000000 >> (bVar2 >> 2 & 0x3e)) & 3);
      pcVar8 = begin_local + uVar4 + 1;
      if (end == pcVar8 || (long)end - (long)pcVar8 < 0) {
LAB_001eabec:
        report_error("invalid format specifier");
      }
      if (bVar2 == 0x7b) {
        report_error("invalid fill character \'{\'");
      }
      cVar3 = *pcVar8;
      valid = true;
      if (cVar3 == '<') {
        uVar6 = 8;
      }
      else if (cVar3 == '^') {
        uVar6 = 0x18;
      }
      else if (cVar3 == '>') {
        uVar6 = 0x10;
      }
      else {
        valid = false;
        uVar6 = 0;
      }
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()(&enter_state,align,valid);
      s.size_ = (long)pcVar8 - (long)begin_local;
      s.data_ = begin_local;
      basic_specs::set_fill<char>((basic_specs *)specs,s);
      (specs->super_format_specs).super_basic_specs.data_ =
           (specs->super_format_specs).super_basic_specs.data_ & 0xffffffc7 | uVar6;
      begin_local = pcVar5 + uVar4 + 2;
      goto LAB_001eaac8;
    case '#':
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                (&enter_state,hash,local_74 < 0xb);
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x20;
      break;
    case '.':
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                (&enter_state,precision,(uVar7 & 0x3e00) != 0);
      begin_local = parse_precision<char>
                              (begin_local,end,&specs->super_format_specs,&specs->precision_ref,ctx)
      ;
      goto LAB_001eaac8;
    case '0':
      if (3 < (int)enter_state.current_state) goto LAB_001eabec;
      enter_state.current_state = zero;
      if (10 < local_74) {
        report_error("format specifier requires numeric argument");
      }
      uVar6 = (specs->super_format_specs).super_basic_specs.data_;
      if ((uVar6 & 0x38) == 0) {
        (specs->super_format_specs).super_basic_specs.fill_data_[0] = '0';
        (specs->super_format_specs).super_basic_specs.data_ = uVar6 & 0xfffc7fc7 | 0x8020;
      }
      break;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case '{':
      if (4 < (int)enter_state.current_state) goto LAB_001eabec;
      enter_state.current_state = width;
      begin_local = parse_width<char>(begin_local,end,&specs->super_format_specs,&specs->width_ref,
                                      ctx);
      goto LAB_001eaac8;
    case '<':
    case '>':
    case '^':
      if (0 < (int)enter_state.current_state) goto LAB_001eabec;
      enter_state.current_state = align;
      if (cVar3 == '<') {
        uVar6 = 8;
      }
      else if (cVar3 == '^') {
        uVar6 = 0x18;
      }
      else if (cVar3 == '>') {
        uVar6 = 0x10;
      }
      else {
        uVar6 = 0;
      }
      (specs->super_format_specs).super_basic_specs.data_ =
           (specs->super_format_specs).super_basic_specs.data_ & 0xffffffc7 | uVar6;
      break;
    case '?':
      pres_type = debug;
      set = 0x3100;
LAB_001eabb4:
      pcVar5 = parse_format_specs<char>::anon_struct_24_3_3d55a02b::operator()
                         (&parse_presentation_type,pres_type,set);
      return pcVar5;
    case 'A':
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
    case 'a':
      pres_type = hex;
LAB_001eabae:
      set = 0xe00;
      goto LAB_001eabb4;
    case 'B':
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
    case 'b':
      pres_type = bin;
      goto LAB_001eab9b;
    case 'E':
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
    case 'e':
      pres_type = debug;
      goto LAB_001eabae;
    case 'F':
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
    case 'f':
      pres_type = fixed;
      goto LAB_001eabae;
    case 'G':
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
    case 'g':
      pres_type = dec;
      goto LAB_001eabae;
    case 'L':
      parse_format_specs<char>::anon_struct_4_1_8b22846b::operator()
                (&enter_state,locale,local_74 < 0xb);
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x40;
      break;
    case 'X':
      pbVar1 = (byte *)((long)&(specs->super_format_specs).super_basic_specs.data_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
    case 'x':
      pres_type = hex;
LAB_001eab9b:
      set = 0x1fe;
      goto LAB_001eabb4;
    case 'c':
      if (arg_type == bool_type) goto LAB_001eabec;
      pres_type = chr;
      goto LAB_001eab9b;
    case 'd':
      pres_type = dec;
      goto LAB_001eab9b;
    case 'o':
      pres_type = oct;
      goto LAB_001eab9b;
    case 'p':
      pres_type = dec;
      set = 0x5000;
      goto LAB_001eabb4;
    case 's':
      pres_type = fixed;
      set = 0x3080;
      goto LAB_001eabb4;
    case '}':
      return begin_local;
    }
    begin_local = begin_local + 1;
LAB_001eaac8:
    if (begin_local == end) {
      return begin_local;
    }
    cVar3 = *begin_local;
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_format_specs(const Char* begin, const Char* end,
                                      dynamic_format_specs<Char>& specs,
                                      parse_context<Char>& ctx, type arg_type)
    -> const Char* {
  auto c = '\0';
  if (end - begin > 1) {
    auto next = to_ascii(begin[1]);
    c = parse_align(next) == align::none ? to_ascii(*begin) : '\0';
  } else {
    if (begin == end) return begin;
    c = to_ascii(*begin);
  }

  struct {
    state current_state = state::start;
    FMT_CONSTEXPR void operator()(state s, bool valid = true) {
      if (current_state >= s || !valid)
        report_error("invalid format specifier");
      current_state = s;
    }
  } enter_state;

  using pres = presentation_type;
  constexpr auto integral_set = sint_set | uint_set | bool_set | char_set;
  struct {
    const Char*& begin;
    format_specs& specs;
    type arg_type;

    FMT_CONSTEXPR auto operator()(pres pres_type, int set) -> const Char* {
      if (!in(arg_type, set)) report_error("invalid format specifier");
      specs.set_type(pres_type);
      return begin + 1;
    }
  } parse_presentation_type{begin, specs, arg_type};

  for (;;) {
    switch (c) {
    case '<':
    case '>':
    case '^':
      enter_state(state::align);
      specs.set_align(parse_align(c));
      ++begin;
      break;
    case '+':
    case ' ':
      specs.set_sign(c == ' ' ? sign::space : sign::plus);
      FMT_FALLTHROUGH;
    case '-':
      enter_state(state::sign, in(arg_type, sint_set | float_set));
      ++begin;
      break;
    case '#':
      enter_state(state::hash, is_arithmetic_type(arg_type));
      specs.set_alt();
      ++begin;
      break;
    case '0':
      enter_state(state::zero);
      if (!is_arithmetic_type(arg_type))
        report_error("format specifier requires numeric argument");
      if (specs.align() == align::none) {
        // Ignore 0 if align is specified for compatibility with std::format.
        specs.set_align(align::numeric);
        specs.set_fill('0');
      }
      ++begin;
      break;
      // clang-format off
    case '1': case '2': case '3': case '4': case '5':
    case '6': case '7': case '8': case '9': case '{':
      // clang-format on
      enter_state(state::width);
      begin = parse_width(begin, end, specs, specs.width_ref, ctx);
      break;
    case '.':
      enter_state(state::precision,
                  in(arg_type, float_set | string_set | cstring_set));
      begin = parse_precision(begin, end, specs, specs.precision_ref, ctx);
      break;
    case 'L':
      enter_state(state::locale, is_arithmetic_type(arg_type));
      specs.set_localized();
      ++begin;
      break;
    case 'd': return parse_presentation_type(pres::dec, integral_set);
    case 'X': specs.set_upper(); FMT_FALLTHROUGH;
    case 'x': return parse_presentation_type(pres::hex, integral_set);
    case 'o': return parse_presentation_type(pres::oct, integral_set);
    case 'B': specs.set_upper(); FMT_FALLTHROUGH;
    case 'b': return parse_presentation_type(pres::bin, integral_set);
    case 'E': specs.set_upper(); FMT_FALLTHROUGH;
    case 'e': return parse_presentation_type(pres::exp, float_set);
    case 'F': specs.set_upper(); FMT_FALLTHROUGH;
    case 'f': return parse_presentation_type(pres::fixed, float_set);
    case 'G': specs.set_upper(); FMT_FALLTHROUGH;
    case 'g': return parse_presentation_type(pres::general, float_set);
    case 'A': specs.set_upper(); FMT_FALLTHROUGH;
    case 'a': return parse_presentation_type(pres::hexfloat, float_set);
    case 'c':
      if (arg_type == type::bool_type) report_error("invalid format specifier");
      return parse_presentation_type(pres::chr, integral_set);
    case 's':
      return parse_presentation_type(pres::string,
                                     bool_set | string_set | cstring_set);
    case 'p':
      return parse_presentation_type(pres::pointer, pointer_set | cstring_set);
    case '?':
      return parse_presentation_type(pres::debug,
                                     char_set | string_set | cstring_set);
    case '}': return begin;
    default:  {
      if (*begin == '}') return begin;
      // Parse fill and alignment.
      auto fill_end = begin + code_point_length(begin);
      if (end - fill_end <= 0) {
        report_error("invalid format specifier");
        return begin;
      }
      if (*begin == '{') {
        report_error("invalid fill character '{'");
        return begin;
      }
      auto alignment = parse_align(to_ascii(*fill_end));
      enter_state(state::align, alignment != align::none);
      specs.set_fill(
          basic_string_view<Char>(begin, to_unsigned(fill_end - begin)));
      specs.set_align(alignment);
      begin = fill_end + 1;
    }
    }
    if (begin == end) return begin;
    c = to_ascii(*begin);
  }
}